

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_ls.c
# Opt level: O0

int CVodeSetPreconditioner(void *cvode_mem,CVLsPrecSetupFn psetup,CVLsPrecSolveFn psolve)

{
  int iVar1;
  code *pcVar2;
  code *pcVar3;
  long in_RDX;
  long in_RSI;
  int retval;
  SUNPSolveFn cvls_psolve;
  SUNPSetupFn cvls_psetup;
  CVLsMem cvls_mem;
  CVodeMem cv_mem;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  char *in_stack_ffffffffffffffc0;
  void *in_stack_ffffffffffffffc8;
  long local_30;
  CVodeMem local_28;
  int local_4;
  
  local_4 = cvLs_AccessLMem(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                            (CVodeMem *)
                            CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                            (CVLsMem *)0x11febe);
  if (local_4 == 0) {
    *(long *)(local_30 + 0xd8) = in_RSI;
    *(long *)(local_30 + 0xe0) = in_RDX;
    if (*(long *)(*(long *)(*(long *)(local_30 + 0x48) + 8) + 0x18) == 0) {
      cvProcessError(local_28,-3,0x1d6,"CVodeSetPreconditioner",
                     "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode_ls.c"
                     ,"SUNLinearSolver object does not support user-supplied preconditioning");
      local_4 = -3;
    }
    else {
      pcVar2 = cvLsPSetup;
      if (in_RSI == 0) {
        pcVar2 = (code *)0x0;
      }
      pcVar3 = cvLsPSolve;
      if (in_RDX == 0) {
        pcVar3 = (code *)0x0;
      }
      iVar1 = SUNLinSolSetPreconditioner(*(undefined8 *)(local_30 + 0x48),local_28,pcVar2,pcVar3);
      if (iVar1 == 0) {
        local_4 = 0;
      }
      else {
        cvProcessError(local_28,-9,0x1e3,"CVodeSetPreconditioner",
                       "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode_ls.c"
                       ,"Error in calling SUNLinSolSetPreconditioner");
        local_4 = -9;
      }
    }
  }
  return local_4;
}

Assistant:

int CVodeSetPreconditioner(void* cvode_mem, CVLsPrecSetupFn psetup,
                           CVLsPrecSolveFn psolve)
{
  CVodeMem cv_mem;
  CVLsMem cvls_mem;
  SUNPSetupFn cvls_psetup;
  SUNPSolveFn cvls_psolve;
  int retval;

  /* access CVLsMem structure */
  retval = cvLs_AccessLMem(cvode_mem, __func__, &cv_mem, &cvls_mem);
  if (retval != CVLS_SUCCESS) { return (retval); }

  /* store function pointers for user-supplied routines in CVLs interface */
  cvls_mem->pset   = psetup;
  cvls_mem->psolve = psolve;

  /* issue error if LS object does not allow user-supplied preconditioning */
  if (cvls_mem->LS->ops->setpreconditioner == NULL)
  {
    cvProcessError(cv_mem, CVLS_ILL_INPUT, __LINE__, __func__, __FILE__,
                   "SUNLinearSolver object does not support user-supplied "
                   "preconditioning");
    return (CVLS_ILL_INPUT);
  }

  /* notify iterative linear solver to call CVLs interface routines */
  cvls_psetup = (psetup == NULL) ? NULL : cvLsPSetup;
  cvls_psolve = (psolve == NULL) ? NULL : cvLsPSolve;
  retval      = SUNLinSolSetPreconditioner(cvls_mem->LS, cv_mem, cvls_psetup,
                                           cvls_psolve);
  if (retval != SUN_SUCCESS)
  {
    cvProcessError(cv_mem, CVLS_SUNLS_FAIL, __LINE__, __func__, __FILE__,
                   "Error in calling SUNLinSolSetPreconditioner");
    return (CVLS_SUNLS_FAIL);
  }

  return (CVLS_SUCCESS);
}